

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O1

string * __thiscall
pbrt::UVMapping2D::ToString_abi_cxx11_(string *__return_storage_ptr__,UVMapping2D *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<float_const&,float_const&,float_const&,float_const&>
            (__return_storage_ptr__,"[ UVMapping2D su: %f sv: %f du: %f dv: %f ]",&this->su,
             &this->sv,&this->du,&this->dv);
  return __return_storage_ptr__;
}

Assistant:

std::string UVMapping2D::ToString() const {
    return StringPrintf("[ UVMapping2D su: %f sv: %f du: %f dv: %f ]", su, sv, du, dv);
}